

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::CallMetaMethod
          (SQVM *this,SQObjectPtr *closure,SQMetaMethod mm,SQInteger nparams,SQObjectPtr *outres)

{
  bool bVar1;
  SQObjectPtr *outres_local;
  SQInteger nparams_local;
  SQMetaMethod mm_local;
  SQObjectPtr *closure_local;
  SQVM *this_local;
  
  this->_nmetamethodscall = this->_nmetamethodscall + 1;
  bVar1 = Call(this,closure,nparams,this->_top - nparams,outres,0);
  if (bVar1) {
    this->_nmetamethodscall = this->_nmetamethodscall + -1;
    Pop(this,nparams);
  }
  else {
    this->_nmetamethodscall = this->_nmetamethodscall + -1;
    Pop(this,nparams);
  }
  return bVar1;
}

Assistant:

bool SQVM::CallMetaMethod(SQObjectPtr &closure,SQMetaMethod SQ_UNUSED_ARG(mm),SQInteger nparams,SQObjectPtr &outres)
{
    //SQObjectPtr closure;

    _nmetamethodscall++;
    if(Call(closure, nparams, _top - nparams, outres, SQFalse)) {
        _nmetamethodscall--;
        Pop(nparams);
        return true;
    }
    _nmetamethodscall--;
    //}
    Pop(nparams);
    return false;
}